

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseProcessorLatencyDeclaration(StructuralParser *this)

{
  ProcessorProperty *pPVar1;
  Expression *pEVar2;
  Processor *pPVar3;
  pool_ptr<soul::AST::Processor> p;
  pool_ptr<soul::AST::Processor> local_d0;
  pool_ptr<soul::AST::ModuleBase> local_c8;
  CompileMessage local_c0;
  CompileMessage local_88;
  CompileMessage local_50;
  
  pPVar1 = parseProcessorProperty(this);
  if (*(int *)&(pPVar1->super_Expression).field_0x2c != 5) {
    Errors::expectedFunctionOrVariable<>();
    AST::Context::throwError
              (&(pPVar1->super_Expression).super_Statement.super_ASTObject.context,&local_50,false);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3521);
  pEVar2 = parseExpression(this,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a19e8);
  local_c8.object = (this->module).object;
  cast<soul::AST::Processor,soul::AST::ModuleBase>((soul *)&local_d0,&local_c8);
  if (local_d0.object != (Processor *)0x0) {
    pPVar3 = pool_ptr<soul::AST::Processor>::operator->(&local_d0);
    if ((pPVar3->latency).object == (Expression *)0x0) {
      pPVar3 = pool_ptr<soul::AST::Processor>::operator->(&local_d0);
      (pPVar3->latency).object = pEVar2;
      return;
    }
    Errors::latencyAlreadyDeclared<>();
    AST::Context::throwError
              (&(pPVar1->super_Expression).super_Statement.super_ASTObject.context,&local_c0,false);
  }
  Errors::latencyOnlyForProcessor<>();
  AST::Context::throwError
            (&(pPVar1->super_Expression).super_Statement.super_ASTObject.context,&local_88,false);
}

Assistant:

void parseProcessorLatencyDeclaration()
    {
        auto& pp = parseProcessorProperty();

        if (pp.property != heart::ProcessorProperty::Property::latency)
            pp.context.throwError (Errors::expectedFunctionOrVariable());

        expect (Operator::assign);
        auto& value = parseExpression();
        expect (Operator::semicolon);

        if (auto p = cast<AST::Processor> (module))
        {
            if (p->latency != nullptr)
                pp.context.throwError (Errors::latencyAlreadyDeclared());

            p->latency = value;
            return;
        }

        pp.context.throwError (Errors::latencyOnlyForProcessor());
    }